

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplaceRealloc<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pointer pos,
          pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
          *args)

{
  ulong uVar1;
  pointer p;
  Symbol *pSVar2;
  ConfigBlockSymbol *pCVar3;
  HierarchicalInstanceSyntax *pHVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  pointer ppVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar11 < uVar1 * 2) {
    uVar11 = uVar1 * 2;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    uVar11 = 0x3ffffffffffffff;
  }
  lVar9 = (long)pos - *(long *)this;
  puVar5 = (undefined8 *)operator_new(uVar11 << 5);
  pSVar2 = (args->first).definition;
  pCVar3 = (args->first).configRoot;
  pHVar4 = args->second;
  puVar6 = (undefined8 *)((long)puVar5 + lVar9 + 0x10);
  *puVar6 = (args->first).configRule;
  puVar6[1] = pHVar4;
  *(undefined8 *)((long)puVar5 + lVar9) = pSVar2;
  ((undefined8 *)((long)puVar5 + lVar9))[1] = pCVar3;
  p = *(pointer *)this;
  lVar10 = *(long *)(this + 8);
  lVar8 = (long)p + (lVar10 * 0x20 - (long)pos);
  ppVar7 = p;
  puVar6 = puVar5;
  if (lVar8 == 0) {
    if (lVar10 != 0) {
      do {
        pSVar2 = (ppVar7->first).definition;
        pCVar3 = (ppVar7->first).configRoot;
        pHVar4 = ppVar7->second;
        puVar6[2] = (ppVar7->first).configRule;
        puVar6[3] = pHVar4;
        *puVar6 = pSVar2;
        puVar6[1] = pCVar3;
        ppVar7 = ppVar7 + 1;
        puVar6 = puVar6 + 4;
      } while (ppVar7 != pos);
    }
  }
  else {
    for (; ppVar7 != pos; ppVar7 = ppVar7 + 1) {
      pSVar2 = (ppVar7->first).definition;
      pCVar3 = (ppVar7->first).configRoot;
      pHVar4 = ppVar7->second;
      puVar6[2] = (ppVar7->first).configRule;
      puVar6[3] = pHVar4;
      *puVar6 = pSVar2;
      puVar6[1] = pCVar3;
      puVar6 = puVar6 + 4;
    }
    memcpy((void *)((long)puVar5 + lVar9 + 0x20),pos,(lVar8 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
    lVar10 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar10 + 1;
  *(ulong *)(this + 0x10) = uVar11;
  *(undefined8 **)this = puVar5;
  return (pointer)((long)puVar5 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}